

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

uint32_t __thiscall
wirehair::Codec::Encode(Codec *this,uint32_t block_id,void *block_out,uint32_t out_buffer_bytes)

{
  bool bVar1;
  ushort uVar2;
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  void *unaff_retaddr;
  void *in_stack_00000008;
  uint8_t *mix2_src;
  uint8_t *mix1_src;
  uint16_t peel_x;
  uint16_t peel_1;
  uint8_t *mix0_src;
  uint8_t *first;
  uint16_t peel_0;
  RowMixIterator mix;
  PeelRowIterator iter;
  PeelRowParameters params;
  uint8_t *src;
  uint8_t *data_out;
  uint copyBytes;
  int in_stack_000000dc;
  void *in_stack_000000e0;
  void *in_stack_000000e8;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  uint16_t distanceToP_1;
  uint16_t distanceToP_2;
  undefined8 in_stack_fffffffffffffef8;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  PeelRowParameters *in_stack_ffffffffffffff08;
  ushort local_e2 [4];
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  short local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  void *local_c8;
  uint local_b8;
  uint32_t local_98;
  int bytes;
  short *vy;
  ushort *vx;
  ushort *in_stack_ffffffffffffff80;
  uint local_4c;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  short *local_40;
  ushort *local_38;
  ushort local_30;
  ushort local_2c;
  ushort local_2a;
  ushort *local_28;
  ushort local_20;
  ushort local_1c;
  ushort local_1a;
  ushort *local_18;
  ushort local_10;
  int in_stack_fffffffffffffff4;
  void *in_stack_fffffffffffffff8;
  
  if (in_RDX == (void *)0x0) {
    local_98 = 0;
  }
  else {
    if ((in_ESI & 0xffff) == (ushort)in_RDI[1] - 1) {
      local_b8 = in_RDI[0xe];
    }
    else {
      local_b8 = *in_RDI;
    }
    if (in_ECX < local_b8) {
      local_98 = 0;
    }
    else if ((in_ESI < (ushort)in_RDI[1]) && ((in_RDI[0x16] & 1) == 0)) {
      local_c8 = (void *)(*(long *)(in_RDI + 0xc) + (ulong)(*in_RDI * in_ESI));
      memcpy(in_RDX,local_c8,(ulong)local_b8);
      local_98 = local_b8;
    }
    else {
      PeelRowParameters::Initialize
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                 (uint16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30),
                 (uint16_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      local_d6 = (ushort)in_RDI[1];
      local_d4 = *(ushort *)((long)in_RDI + 6);
      vx = local_e2 + 3;
      vy = &local_d2;
      bytes = CONCAT22(local_d6,local_d4);
      local_da = local_d0;
      local_d8 = local_ce;
      local_42 = (ushort)in_RDI[6];
      local_44 = *(ushort *)((long)in_RDI + 0x1a);
      local_38 = local_e2;
      local_40 = &local_d2;
      local_46 = local_cc;
      for (local_4c = 1; local_4c < 3; local_4c = local_4c + 1) {
        local_28 = &local_46;
        local_46 = (ushort)((ulong)((uint)local_46 + (uint)local_ca) %
                           (ulong)(long)(int)(uint)local_44);
        if (local_42 <= local_46) {
          local_30 = local_44 - local_46;
          if (local_ca < local_30) {
            local_46 = (ushort)(((uint)local_ca * 0x10000 - (uint)local_30) % (uint)local_ca);
          }
          else {
            local_46 = local_ca - local_30;
          }
        }
        local_38[local_4c] = local_46;
        local_2c = local_44;
        local_2a = local_42;
      }
      if (local_d2 == 1) {
        bVar1 = false;
        local_e2[3] = 0;
      }
      else {
        local_e2[3] = local_d2 + -2;
        local_18 = &local_da;
        local_da = (ushort)((ulong)((uint)local_d0 + (uint)local_ce) %
                           (ulong)(long)(int)(uint)local_d4);
        if (local_d6 <= local_d0) {
          local_20 = local_d4 - local_d0;
          if (local_ce < local_20) {
            local_da = (ushort)(((uint)local_ce * 0x10000 - (uint)local_20) % (uint)local_ce);
          }
          else {
            local_da = local_ce - local_20;
          }
        }
        bVar1 = true;
        local_1c = local_d4;
        local_1a = local_d6;
      }
      if (bVar1) {
        gf256_addset_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                         in_stack_fffffffffffffff4);
        while( true ) {
          if (local_e2[3] == 0) {
            bVar1 = false;
          }
          else {
            local_e2[3] = local_e2[3] + -1;
            uVar2 = (ushort)((ulong)((uint)local_da + (uint)local_d8) %
                            (ulong)(long)(int)(uint)local_d4);
            if (local_d6 <= local_da) {
              local_10 = local_d4 - local_da;
              if (local_d8 < local_10) {
                uVar2 = (ushort)(((uint)local_d8 * 0x10000 - (uint)local_10) % (uint)local_d8);
              }
              else {
                uVar2 = local_d8 - local_10;
              }
            }
            local_da = uVar2;
            bVar1 = true;
          }
          if (!bVar1) break;
          in_stack_ffffffffffffff80 = local_e2 + 3;
          gf256_add_mem(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
        }
        gf256_add_mem(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
      }
      else {
        gf256_addset_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                         in_stack_fffffffffffffff4);
      }
      gf256_add2_mem(in_stack_ffffffffffffff80,vx,vy,bytes);
      local_98 = local_b8;
    }
  }
  return local_98;
}

Assistant:

uint32_t Codec::Encode(
    const uint32_t block_id, ///< Block id to generate
    void * GF256_RESTRICT block_out, ///< Block data output
    uint32_t out_buffer_bytes ///< Bytes in block
)
{
    if (!block_out) {
        return 0;
    }

    unsigned copyBytes;

    // If this is the last block:
    if ((uint16_t)block_id == _block_count - 1) {
        copyBytes = _input_final_bytes;
    }
    else {
        copyBytes = _block_bytes;
    }

    // If not enough space in output buffer:
    if (out_buffer_bytes < copyBytes) {
        return 0;
    }

    uint8_t * GF256_RESTRICT data_out = reinterpret_cast<uint8_t *>( block_out );

#if defined(CAT_COPY_FIRST_N)
    // Note that if the encoder was a decoder the original message blocks may
    // not be available, so we regenerate them each time using the recovery set.
    // This means that wirehair_encode() after conversion will be slow for the
    // set of original blocks.  I noted this in the API comments to help devs.

    // For the original message blocks (id < N):
    if (block_id < _block_count &&
        !_original_out_of_order)
    {
        const uint8_t * GF256_RESTRICT src = _input_blocks + _block_bytes * block_id;

        // Copy from the original file data
        memcpy(data_out, src, copyBytes);
        return copyBytes;
    }
#endif // CAT_COPY_FIRST_N

    CAT_IF_DUMP(cout << "Encode: Generating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

    // If peeler has multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            data_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            copyBytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                data_out,
                _recovery_blocks + _block_bytes * peel_x,
                copyBytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(data_out, mix0_src, copyBytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(data_out, first, mix0_src, copyBytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Add in remaining 2 mixer columns:

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix2_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(data_out, mix1_src, mix2_src, copyBytes);

    CAT_IF_DUMP(cout << endl;)

    return copyBytes;
}